

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O3

ssize_t __thiscall
anon_unknown.dwarf_392792::read
          (anon_unknown_dwarf_392792 *this,int __fd,void *__buf,size_t __nbytes)

{
  long *plVar1;
  long lVar2;
  ssize_t sVar3;
  ulong uVar4;
  undefined4 in_register_00000034;
  
  plVar1 = *(long **)(this + 0x18);
  lVar2 = (**(code **)(*plVar1 + 0x18))(plVar1);
  if (lVar2 == CONCAT44(in_register_00000034,__fd)) {
    if (__nbytes != 0) {
      sVar3 = (**(code **)(*plVar1 + 0x10))(plVar1,__buf,__nbytes);
      return sVar3;
    }
    uVar4 = 0;
  }
  else {
    uVar4 = (ulong)(__nbytes == 0);
  }
  return uVar4;
}

Assistant:

unsigned long read(FT_Stream rec, unsigned long offset, unsigned char* buffer, unsigned long count)
    {
        sf::Int64 convertedOffset = static_cast<sf::Int64>(offset);
        sf::InputStream* stream = static_cast<sf::InputStream*>(rec->descriptor.pointer);
        if (stream->seek(convertedOffset) == convertedOffset)
        {
            if (count > 0)
                return static_cast<unsigned long>(stream->read(reinterpret_cast<char*>(buffer), static_cast<sf::Int64>(count)));
            else
                return 0;
        }
        else
            return count > 0 ? 0 : 1; // error code is 0 if we're reading, or nonzero if we're seeking
    }